

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prediction_scheme_wrap_transform_base.h
# Opt level: O0

void __thiscall
draco::PredictionSchemeWrapTransformBase<int>::PredictionSchemeWrapTransformBase
          (PredictionSchemeWrapTransformBase<int> *this)

{
  undefined4 *in_RDI;
  
  *in_RDI = 0;
  in_RDI[1] = 0;
  in_RDI[2] = 0;
  in_RDI[3] = 0;
  in_RDI[4] = 0;
  in_RDI[5] = 0;
  std::vector<int,_std::allocator<int>_>::vector((vector<int,_std::allocator<int>_> *)0x1f06cb);
  return;
}

Assistant:

PredictionSchemeWrapTransformBase()
      : num_components_(0),
        min_value_(0),
        max_value_(0),
        max_dif_(0),
        max_correction_(0),
        min_correction_(0) {}